

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset,size_t looper)

{
  CPpmd7 *p;
  CPpmd7z_RangeDec *rc;
  rar_filter **pprVar1;
  size_t *psVar2;
  rar *rar;
  void *pvVar3;
  long lVar4;
  rar_filter *prVar5;
  void *pvVar6;
  long lVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  rar_filter **pprVar12;
  void *pvVar13;
  uchar *puVar14;
  size_t sVar15;
  unsigned_long uVar16;
  size_t __n;
  char *fmt;
  uint uVar17;
  ulong uVar18;
  void *__src;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  rar_filter *filter;
  ulong uVar22;
  int64_t end;
  long local_70;
  ulong local_68;
  void *local_60;
  void *local_58;
  size_t local_50;
  rar_br *local_48;
  ulong *local_40;
  ssize_t *local_38;
  
  if (0x400 < looper) {
    return -0x1e;
  }
  local_50 = looper + 1;
  rar = (rar *)a->format->data;
  local_48 = &rar->br;
  local_38 = &(rar->br).avail_in;
  p = &rar->ppmd7_context;
  rc = &rar->range_dec;
  iVar10 = 0;
LAB_001268dd:
  do {
    if (rar->valid == '\0') {
      return -0x1e;
    }
    sVar15 = (rar->filters).bytes_ready;
    if (sVar15 != 0) {
      uVar21 = rar->unp_offset;
      if ((ulong)uVar21 == 0) {
        puVar8 = (rar->filters).bytes;
        *buff = puVar8;
        *size = sVar15;
        rar->offset = rar->offset + sVar15;
        lVar4 = rar->offset_outgoing;
        *offset = lVar4;
        rar->offset_outgoing = lVar4 + *size;
        psVar2 = &(rar->filters).bytes_ready;
        *psVar2 = *psVar2 - *size;
        (rar->filters).bytes = puVar8 + *size;
        puVar14 = (uchar *)*buff;
        goto LAB_00126f86;
      }
      puVar14 = rar->unp_buffer;
      *buff = puVar14;
      *size = (ulong)uVar21;
      rar->unp_offset = 0;
LAB_00126f13:
      lVar4 = rar->offset_outgoing;
      *offset = lVar4;
      rar->offset_outgoing = lVar4 + *size;
LAB_00126f86:
      uVar16 = crc32(rar->crc_calculated,puVar14,(int)*size);
      rar->crc_calculated = uVar16;
      return iVar10;
    }
    if (rar->ppmd_eod != '\0') {
LAB_00126e4c:
      uVar21 = rar->unp_offset;
      if ((ulong)uVar21 != 0) {
        puVar14 = rar->unp_buffer;
        *buff = puVar14;
        *size = (ulong)uVar21;
        lVar4 = rar->offset_outgoing;
        *offset = lVar4;
        rar->offset_outgoing = lVar4 + *size;
        uVar16 = crc32(rar->crc_calculated,puVar14,(int)*size);
        rar->crc_calculated = uVar16;
        rar->unp_offset = 0;
        return 0;
      }
      *buff = (void *)0x0;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc == rar->crc_calculated) {
        rar->entry_eof = '\x01';
        return 1;
      }
      fmt = "File CRC error";
LAB_00127015:
      archive_set_error(&a->archive,0x54,fmt);
      return -0x1e;
    }
    if (rar->dictionary_size == 0) {
LAB_0012692e:
      if ((rar->filters).lastend == (rar->filters).filterstart) {
        pvVar3 = a->format->data;
        filter = *(rar_filter **)((long)pvVar3 + 0x3a0);
        if (filter == (rar_filter *)0x0) {
          return -0x1e;
        }
        lVar4 = *(long *)((long)pvVar3 + 0x3a8);
        local_68 = (ulong)filter->blocklength + lVar4;
        *(undefined8 *)((long)pvVar3 + 0x3a8) = 0x7fffffffffffffff;
        local_40 = size;
        iVar9 = expand(a,(int64_t *)&local_68);
        uVar18 = local_68;
        if (iVar9 != 0) {
          return -0x1e;
        }
        pprVar1 = (rar_filter **)((long)pvVar3 + 0x3a0);
        pprVar12 = pprVar1;
        do {
          prVar5 = *pprVar12;
          if (prVar5 == (rar_filter *)0x0) {
            return -0x1e;
          }
          pprVar12 = &prVar5->next;
        } while (prVar5 != filter);
        if ((long)local_68 < 0) {
          return -0x1e;
        }
        uVar21 = filter->blocklength;
        __n = (size_t)uVar21;
        if (local_68 != __n + lVar4) {
          return -0x1e;
        }
        pvVar13 = *(void **)((long)pvVar3 + 0x390);
        if (pvVar13 == (void *)0x0) {
          pvVar13 = calloc(1,0x40024);
          *(void **)((long)pvVar3 + 0x390) = pvVar13;
          if (pvVar13 == (void *)0x0) {
            return -0x1e;
          }
        }
        if (uVar21 < 0x40001) {
          pvVar6 = a->format->data;
          uVar20 = (uint)lVar4 & *(uint *)((long)pvVar6 + 0x358);
          uVar17 = (*(uint *)((long)pvVar6 + 0x358) - uVar20) + 1;
          if (-1 < (int)uVar17) {
            pvVar13 = (void *)((long)pvVar13 + 0x20);
            __src = (void *)((long)(int)uVar20 + *(long *)((long)pvVar6 + 0x350));
            if (uVar17 < uVar21) {
              local_60 = pvVar6;
              local_58 = pvVar13;
              memcpy(pvVar13,__src,(ulong)uVar17);
              __src = *(void **)((long)local_60 + 0x350);
              __n = (size_t)(int)(uVar21 - uVar17);
              pvVar13 = local_58;
            }
            memcpy(pvVar13,__src,__n);
            while( true ) {
              iVar9 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar3 + 0x390),
                                     *(size_t *)((long)pvVar3 + 0xb8));
              if (iVar9 == 0) {
                return -0x1e;
              }
              uVar21 = filter->filteredblockaddress;
              uVar17 = filter->filteredblocklength;
              *pprVar1 = filter->next;
              filter->next = (rar_filter *)0x0;
              delete_filter(filter);
              filter = *pprVar1;
              if (filter == (rar_filter *)0x0) goto LAB_00126d5f;
              uVar22 = filter->blockstartpos;
              if ((uVar22 != *(ulong *)((long)pvVar3 + 0x3a8)) || (filter->blocklength != uVar17))
              break;
              memmove((void *)(*(long *)((long)pvVar3 + 0x390) + 0x20),
                      (void *)(*(long *)((long)pvVar3 + 0x390) + (ulong)uVar21 + 0x20),(ulong)uVar17
                     );
            }
            if (uVar22 < uVar18) {
              return -0x1e;
            }
            *(ulong *)((long)pvVar3 + 0x3a8) = uVar22;
LAB_00126d5f:
            *(ulong *)((long)pvVar3 + 0x3b8) = uVar18;
            *(ulong *)((long)pvVar3 + 0x3c0) =
                 *(long *)((long)pvVar3 + 0x390) + (ulong)uVar21 + 0x20;
            *(ulong *)((long)pvVar3 + 0x3c8) = (ulong)uVar17;
            size = local_40;
            goto LAB_00126d9f;
          }
        }
        fmt = "Bad RAR file data";
        goto LAB_00127015;
      }
      if (((rar->br).next_in == (uchar *)0x0) &&
         (iVar10 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
        puVar14 = (uchar *)rar_read_ahead(a,1,local_38);
        (rar->br).next_in = puVar14;
        if (puVar14 == (uchar *)0x0) {
          fmt = "Truncated RAR file data";
          goto LAB_00127015;
        }
        if ((rar->br).cache_avail == 0) {
          rar_br_fillup(a,local_48);
        }
        iVar10 = 0;
      }
      if ((rar->start_new_table != '\0') && (iVar10 = parse_codes(a), iVar10 < -0x14)) {
        return iVar10;
      }
      if (rar->is_ppmd_block == '\0') {
        lVar4 = rar->offset;
        local_70 = lVar4 + -0x104;
        if ((ulong)rar->dictionary_size < 0x105) {
          local_70 = lVar4;
        }
        local_70 = local_70 + (ulong)rar->dictionary_size;
        lVar7 = (rar->filters).filterstart;
        if (lVar7 < local_70) {
          local_70 = lVar7;
        }
        iVar10 = expand(a,&local_70);
        if (iVar10 != 0) {
          return iVar10;
        }
        lVar7 = (rar->filters).filterstart;
        sVar15 = local_70 - lVar4;
        rar->bytes_uncopied = sVar15;
        (rar->filters).lastend = local_70;
        if (sVar15 == 0 && local_70 != lVar7) {
          fmt = "Internal error extracting RAR file";
          goto LAB_00127015;
        }
      }
      else {
        iVar9 = Ppmd7_DecodeSymbol(p,&rc->p);
        if (iVar9 < 0) {
LAB_00126f34:
          fmt = "Invalid symbol";
          goto LAB_00127015;
        }
        if (iVar9 == rar->ppmd_escape) {
          iVar11 = Ppmd7_DecodeSymbol(p,&rc->p);
          if (iVar11 < 0) goto LAB_00126f34;
          switch(iVar11) {
          case 0:
            rar->start_new_table = '\x01';
            iVar10 = read_data_compressed(a,buff,size,offset,local_50);
            return iVar10;
          default:
            goto switchD_00126bf2_caseD_1;
          case 2:
            rar->ppmd_eod = '\x01';
            goto LAB_00126d9f;
          case 3:
            archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
            return -0x19;
          case 4:
            uVar21 = 0;
            bVar19 = 0x10;
            for (iVar10 = 2; iVar9 = Ppmd7_DecodeSymbol(p,&rc->p), -1 < iVar10; iVar10 = iVar10 + -1
                ) {
              if (iVar9 < 0) goto LAB_00126f2b;
              uVar21 = uVar21 | iVar9 << (bVar19 & 0x1f);
              bVar19 = bVar19 - 8;
            }
            if (iVar9 < 0) {
LAB_00126f2b:
              fmt = "Invalid symbol";
              goto LAB_00127015;
            }
            uVar18 = (ulong)(iVar9 + 0x20U);
            lzss_emit_match(rar,uVar21 + 2,iVar9 + 0x20U);
            break;
          case 5:
            iVar10 = Ppmd7_DecodeSymbol(p,&rc->p);
            if (iVar10 < 0) goto LAB_00126f34;
            uVar18 = (ulong)(iVar10 + 4U);
            lzss_emit_match(rar,1,iVar10 + 4U);
          }
        }
        else {
switchD_00126bf2_caseD_1:
          lzss_emit_literal(rar,(uint8_t)iVar9);
          uVar18 = 1;
        }
        sVar15 = uVar18 + rar->bytes_uncopied;
        rar->bytes_uncopied = sVar15;
      }
      uVar18 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
      if ((long)sVar15 < (long)uVar18) {
        uVar18 = sVar15;
      }
      iVar10 = copy_from_lzss_window_to_unp(a,buff,rar->offset,uVar18);
      if (iVar10 != 0) {
        return iVar10;
      }
      rar->offset = rar->offset + uVar18;
      rar->bytes_uncopied = rar->bytes_uncopied - uVar18;
      iVar10 = 0;
LAB_00126d9f:
      puVar14 = (uchar *)*buff;
      if (puVar14 != (uchar *)0x0) {
        rar->unp_offset = 0;
        *size = (ulong)rar->unp_buffer_size;
        goto LAB_00126f13;
      }
      goto LAB_001268dd;
    }
    if (rar->unp_size <= rar->offset) goto LAB_00126e4c;
    if ((rar->is_ppmd_block != '\0') || (uVar18 = rar->bytes_uncopied, (long)uVar18 < 1))
    goto LAB_0012692e;
    uVar22 = (ulong)(rar->unp_buffer_size - rar->unp_offset);
    if (uVar18 < uVar22) {
      uVar22 = uVar18;
    }
    iVar10 = copy_from_lzss_window_to_unp(a,buff,rar->offset,uVar22);
    if (iVar10 != 0) {
      return iVar10;
    }
    rar->offset = rar->offset + uVar22;
    rar->bytes_uncopied = rar->bytes_uncopied - uVar22;
    pvVar3 = *buff;
    iVar10 = 0;
    if (pvVar3 != (void *)0x0) {
      rar->unp_offset = 0;
      *size = (ulong)rar->unp_buffer_size;
      lVar4 = rar->offset_outgoing;
      *offset = lVar4;
      rar->offset_outgoing = lVar4 + *size;
      uVar16 = crc32(rar->crc_calculated,pvVar3,(int)*size);
      rar->crc_calculated = uVar16;
      return 0;
    }
  } while( true );
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
                     int64_t *offset, size_t looper)
{
  if (looper++ > MAX_COMPRESS_DEPTH)
    return (ARCHIVE_FATAL);

  struct rar *rar;
  int64_t start, end;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);

    if (rar->filters.bytes_ready > 0)
    {
      /* Flush unp_buffer first */
      if (rar->unp_offset > 0)
      {
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        rar->unp_offset = 0;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
      }
      else
      {
        *buff = rar->filters.bytes;
        *size = rar->filters.bytes_ready;

        rar->offset += *size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;

        rar->filters.bytes_ready -= *size;
        rar->filters.bytes += *size;
      }
      goto ending_block;
    }

    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (rar->filters.lastend == rar->filters.filterstart)
    {
      if (!run_filters(a))
        return (ARCHIVE_FATAL);
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset, looper);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;

      /* We don't want to overflow the window and overwrite data that we write
       * at 'start'. Therefore, reduce the end length by the maximum match size,
       * which is 260 bytes. You can compute this maximum by looking at the
       * definition of 'expand', in particular when 'symbol >= 271'. */
      /* NOTE: It's possible for 'dictionary_size' to be less than this 260
       * value, however that will only be the case when 'unp_size' is small,
       * which should only happen when the entry size is small and there's no
       * risk of overflowing the buffer */
      if (rar->dictionary_size > 260) {
        end -= 260;
      }

      if (rar->filters.filterstart < end) {
        end = rar->filters.filterstart;
      }

      ret = expand(a, &end);
      if (ret != ARCHIVE_OK)
	      return (ret);

      rar->bytes_uncopied = end - start;
      rar->filters.lastend = end;
      if (rar->filters.lastend != rar->filters.filterstart && rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
ending_block:
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}